

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  ulong *puVar1;
  vector<char_const*,std::allocator<char_const*>> *this_00;
  char cVar2;
  uint minY;
  uint maxY;
  uint uVar3;
  CompressorScheme CVar4;
  iterator __position;
  char *pcVar5;
  byte bVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  size_type *psVar11;
  char *pcVar12;
  char *compressed;
  pointer pCVar13;
  pointer pCVar14;
  pointer pCVar15;
  pointer ppcVar16;
  BaseExc *pBVar17;
  InputExc *this_01;
  long lVar18;
  char *pcVar19;
  uchar auVar20 [2];
  char *extraout_RDX;
  pointer pCVar21;
  uint uVar22;
  pointer pCVar23;
  undefined1 *toNonlinear;
  ulong uVar24;
  ulong uVar25;
  int byte;
  ulong uVar26;
  size_t __n;
  bool bVar27;
  ulong local_370;
  char *local_360;
  char *local_358;
  char *inDataPtr;
  char *local_338;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  channelRules;
  size_t outBufferSize;
  uchar b [2];
  undefined6 uStack_2e6;
  _Bit_pointer local_2c8;
  char *writePtr;
  int local_290;
  int local_28c;
  
  inDataPtr = inPtr;
  local_338 = inPtr;
  initializeDefaultChannelRules(this);
  outBufferSize = 0;
  initializeBuffers(this,&outBufferSize);
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  relevantChannelRules(this,&channelRules);
  if ((long)channelRules.
            super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)channelRules.
            super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    auVar20[0] = '\x02';
    auVar20[1] = '\0';
  }
  else {
    lVar18 = ((long)channelRules.
                    super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)channelRules.
                    super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar18 = lVar18 + (ulong)(lVar18 == 0);
    psVar11 = &((channelRules.
                 super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_string_length;
    auVar20[0] = '\x02';
    auVar20[1] = '\0';
    do {
      auVar20 = (uchar  [2])((short)auVar20 + (short)*psVar11 + 3);
      psVar11 = psVar11 + 6;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  uVar26 = outBufferSize + (ushort)auVar20;
  outBufferSize = uVar26;
  if (this->_outBufferSize < uVar26) {
    this->_outBufferSize = uVar26;
    if (this->_outBuffer != (char *)0x0) {
      operator_delete__(this->_outBuffer);
    }
    pcVar12 = (char *)operator_new__(uVar26);
    this->_outBuffer = pcVar12;
  }
  else {
    pcVar12 = this->_outBuffer;
  }
  local_358 = this->_packedAcBuffer;
  local_360 = this->_packedDcBuffer;
  uVar22 = (range->max).x;
  if (this->_max[0] < (int)uVar22) {
    uVar22 = this->_max[0];
  }
  uVar26 = (ulong)uVar22;
  iVar10 = (range->min).x;
  minY = (range->min).y;
  maxY = (range->max).y;
  if (this->_max[1] < (int)maxY) {
    maxY = this->_max[1];
  }
  pcVar12[0x48] = '\0';
  pcVar12[0x49] = '\0';
  pcVar12[0x4a] = '\0';
  pcVar12[0x4b] = '\0';
  pcVar12[0x4c] = '\0';
  pcVar12[0x4d] = '\0';
  pcVar12[0x4e] = '\0';
  pcVar12[0x4f] = '\0';
  pcVar12[0x50] = '\0';
  pcVar12[0x51] = '\0';
  pcVar12[0x52] = '\0';
  pcVar12[0x53] = '\0';
  pcVar12[0x54] = '\0';
  pcVar12[0x55] = '\0';
  pcVar12[0x56] = '\0';
  pcVar12[0x57] = '\0';
  pcVar12[0x38] = '\0';
  pcVar12[0x39] = '\0';
  pcVar12[0x3a] = '\0';
  pcVar12[0x3b] = '\0';
  pcVar12[0x3c] = '\0';
  pcVar12[0x3d] = '\0';
  pcVar12[0x3e] = '\0';
  pcVar12[0x3f] = '\0';
  pcVar12[0x40] = '\0';
  pcVar12[0x41] = '\0';
  pcVar12[0x42] = '\0';
  pcVar12[0x43] = '\0';
  pcVar12[0x44] = '\0';
  pcVar12[0x45] = '\0';
  pcVar12[0x46] = '\0';
  pcVar12[0x47] = '\0';
  pcVar12[0x28] = '\0';
  pcVar12[0x29] = '\0';
  pcVar12[0x2a] = '\0';
  pcVar12[0x2b] = '\0';
  pcVar12[0x2c] = '\0';
  pcVar12[0x2d] = '\0';
  pcVar12[0x2e] = '\0';
  pcVar12[0x2f] = '\0';
  pcVar12[0x30] = '\0';
  pcVar12[0x31] = '\0';
  pcVar12[0x32] = '\0';
  pcVar12[0x33] = '\0';
  pcVar12[0x34] = '\0';
  pcVar12[0x35] = '\0';
  pcVar12[0x36] = '\0';
  pcVar12[0x37] = '\0';
  pcVar12[0x18] = '\0';
  pcVar12[0x19] = '\0';
  pcVar12[0x1a] = '\0';
  pcVar12[0x1b] = '\0';
  pcVar12[0x1c] = '\0';
  pcVar12[0x1d] = '\0';
  pcVar12[0x1e] = '\0';
  pcVar12[0x1f] = '\0';
  pcVar12[0x20] = '\0';
  pcVar12[0x21] = '\0';
  pcVar12[0x22] = '\0';
  pcVar12[0x23] = '\0';
  pcVar12[0x24] = '\0';
  pcVar12[0x25] = '\0';
  pcVar12[0x26] = '\0';
  pcVar12[0x27] = '\0';
  pcVar12[8] = '\0';
  pcVar12[9] = '\0';
  pcVar12[10] = '\0';
  pcVar12[0xb] = '\0';
  pcVar12[0xc] = '\0';
  pcVar12[0xd] = '\0';
  pcVar12[0xe] = '\0';
  pcVar12[0xf] = '\0';
  pcVar12[0x10] = '\0';
  pcVar12[0x11] = '\0';
  pcVar12[0x12] = '\0';
  pcVar12[0x13] = '\0';
  pcVar12[0x14] = '\0';
  pcVar12[0x15] = '\0';
  pcVar12[0x16] = '\0';
  pcVar12[0x17] = '\0';
  pcVar12[0] = '\x02';
  pcVar12[1] = '\0';
  pcVar12[2] = '\0';
  pcVar12[3] = '\0';
  pcVar12[4] = '\0';
  pcVar12[5] = '\0';
  pcVar12[6] = '\0';
  pcVar12[7] = '\0';
  *(ulong *)(pcVar12 + 0x50) = (ulong)this->_acCompression;
  setupChannelData(this,iVar10,minY,uVar22,maxY);
  compressed = pcVar12 + (ulong)(ushort)auVar20 + 0x58;
  writePtr = this->_outBuffer + 0x58;
  b[0] = auVar20[0];
  b[1] = auVar20[1];
  lVar18 = 0;
  do {
    pcVar19 = writePtr;
    uVar26 = CONCAT71((int7)(uVar26 >> 8),b[lVar18]);
    writePtr = writePtr + 1;
    *pcVar19 = b[lVar18];
    lVar18 = lVar18 + 1;
  } while ((int)lVar18 != 2);
  if (channelRules.
      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      channelRules.
      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar18 = 0;
    uVar24 = 0;
    do {
      Classifier::write((Classifier *)
                        ((long)&((channelRules.
                                  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_dataplus.
                                _M_p + lVar18),(int)&writePtr,pcVar19,uVar26);
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 0x30;
      pcVar19 = extraout_RDX;
    } while (uVar24 < (ulong)(((long)channelRules.
                                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)channelRules.
                                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x5555555555555555));
  }
  writePtr = (char *)((ulong)writePtr & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)b,
             ((long)(this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
             (bool *)&writePtr,(allocator_type *)&rowPtrs);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector(&rowPtrs,((long)(this->_channelData).
                           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_channelData).
                           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
           (allocator_type *)&writePtr);
  pCVar21 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar13 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pCVar13 - (long)pCVar21 != 0) {
    uVar26 = ((long)pCVar13 - (long)pCVar21 >> 3) * -0x79435e50d79435e5;
    uVar22 = 0;
    do {
      bVar6 = (byte)uVar22 & 0x3f;
      puVar1 = (ulong *)(CONCAT62(uStack_2e6,b) + (ulong)(uVar22 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar22 = uVar22 + 1;
    } while (uVar22 <= uVar26 && uVar26 - uVar22 != 0);
  }
  inDataPtr = local_338;
  pcVar19 = local_338;
  pCVar14 = pCVar21;
  pCVar23 = pCVar13;
  if ((int)minY <= (int)maxY) {
    do {
      pCVar21 = pCVar14;
      if (pCVar13 != pCVar14) {
        uVar22 = 1;
        uVar26 = 0;
        pCVar14 = pCVar23;
        do {
          uVar3 = pCVar21[uVar26].ySampling;
          if ((int)minY < 0) {
            if (-1 < (int)uVar3) {
              uVar8 = (uVar3 + ~minY) / uVar3;
              goto LAB_00449154;
            }
            uVar8 = (~uVar3 - minY) / -uVar3;
          }
          else if ((int)uVar3 < 0) {
            uVar8 = minY / -uVar3;
LAB_00449154:
            uVar8 = -uVar8;
          }
          else {
            uVar8 = minY / uVar3;
          }
          if (minY == uVar8 * uVar3) {
            this_00 = (vector<char_const*,std::allocator<char_const*>> *)
                      (rowPtrs.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar26);
            __position._M_current = *(char ***)(this_00 + 8);
            if (__position._M_current == *(char ***)(this_00 + 0x10)) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>(this_00,__position,&inDataPtr);
            }
            else {
              *__position._M_current = pcVar19;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
            iVar10 = pCVar21[uVar26].width;
            iVar9 = pixelTypeSize(pCVar21[uVar26].type);
            pcVar19 = inDataPtr + (long)iVar9 * (long)iVar10;
            pCVar21 = (this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar14 = (this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            inDataPtr = pcVar19;
          }
          uVar26 = (ulong)uVar22;
          uVar24 = ((long)pCVar14 - (long)pCVar21 >> 3) * -0x79435e50d79435e5;
          uVar22 = uVar22 + 1;
          pCVar23 = pCVar14;
        } while (uVar26 <= uVar24 && uVar24 - uVar26 != 0);
      }
      bVar27 = minY != maxY;
      pCVar13 = pCVar14;
      pCVar14 = pCVar21;
      minY = minY + 1;
    } while (bVar27);
  }
  inDataPtr = local_338;
  pCVar15 = (this->_cscSets).
            super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cscSets).
      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar15) {
    uVar26 = 0;
    uVar24 = 1;
    do {
      iVar10 = pCVar15[uVar26].idx[0];
      pCVar13 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      LossyDctEncoderCsc::LossyDctEncoderCsc
                ((LossyDctEncoderCsc *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar10,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar15[uVar26].idx[1],
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar15[uVar26].idx[2],local_358,
                 local_360,(unsigned_short *)dwaCompressorToNonlinear,pCVar13[iVar10].width,
                 pCVar13[iVar10].height,pCVar13[iVar10].type,pCVar13[pCVar15[uVar26].idx[1]].type,
                 pCVar13[pCVar15[uVar26].idx[2]].type);
      LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
      *(long *)(pcVar12 + 0x40) = *(long *)(pcVar12 + 0x40) + (long)local_290;
      *(long *)(pcVar12 + 0x48) = *(long *)(pcVar12 + 0x48) + (long)local_28c;
      pCVar15 = (this->_cscSets).
                super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = pCVar15[uVar26].idx[0];
      lVar18 = CONCAT62(uStack_2e6,b);
      iVar9 = iVar10 + 0x3f;
      if (-1 < (long)iVar10) {
        iVar9 = iVar10;
      }
      puVar1 = (ulong *)(lVar18 + (long)(iVar9 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar10 & 0x3f);
      iVar10 = pCVar15[uVar26].idx[1];
      iVar9 = iVar10 + 0x3f;
      if (-1 < (long)iVar10) {
        iVar9 = iVar10;
      }
      puVar1 = (ulong *)(lVar18 + (long)(iVar9 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar10 & 0x3f);
      local_358 = local_358 + (long)local_290 * 2;
      local_360 = local_360 + (long)local_28c * 2;
      iVar10 = pCVar15[uVar26].idx[2];
      iVar9 = iVar10 + 0x3f;
      if (-1 < (long)iVar10) {
        iVar9 = iVar10;
      }
      puVar1 = (ulong *)(lVar18 + (long)(iVar9 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar10 & 0x3f);
      LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
      pCVar15 = (this->_cscSets).
                super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar26 = ((long)(this->_cscSets).
                      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar15 >> 2) *
               -0x5555555555555555;
      bVar27 = uVar24 <= uVar26;
      lVar18 = uVar26 - uVar24;
      uVar26 = uVar24;
      uVar24 = (ulong)((int)uVar24 + 1);
    } while (bVar27 && lVar18 != 0);
    pCVar21 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar23 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar23 != pCVar21) {
    lVar18 = CONCAT62(uStack_2e6,b);
    uVar26 = 0;
    do {
      if ((*(ulong *)(lVar18 + (uVar26 >> 6) * 8) >> (uVar26 & 0x3f) & 1) == 0) {
        CVar4 = pCVar21[uVar26].compression;
        if (CVar4 == UNKNOWN) {
          iVar10 = pCVar21[uVar26].width;
          iVar9 = pixelTypeSize(pCVar21[uVar26].type);
          ppcVar16 = rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar26].
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (rowPtrs.
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar26].
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppcVar16) {
            __n = (long)iVar9 * (long)iVar10;
            pcVar19 = pCVar21[uVar26].planarUncBufferEnd;
            uVar24 = 0;
            uVar25 = 1;
            do {
              memcpy(pcVar19,ppcVar16[uVar24],__n);
              pcVar19 = pCVar21[uVar26].planarUncBufferEnd + __n;
              pCVar21[uVar26].planarUncBufferEnd = pcVar19;
              ppcVar16 = rowPtrs.
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              bVar27 = uVar25 < (ulong)((long)rowPtrs.
                                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppcVar16 >> 3);
              uVar24 = uVar25;
              uVar25 = (ulong)((int)uVar25 + 1);
            } while (bVar27);
          }
          *(long *)(pcVar12 + 8) = *(long *)(pcVar12 + 8) + (long)pCVar21[uVar26].planarUncSize;
        }
        else if (CVar4 == LOSSY_DCT) {
          toNonlinear = dwaCompressorToNonlinear;
          if (pCVar21[uVar26].pLinear != false) {
            toNonlinear = (undefined1 *)0x0;
          }
          LossyDctEncoder::LossyDctEncoder
                    ((LossyDctEncoder *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                     rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar26,local_358,local_360,
                     (unsigned_short *)toNonlinear,pCVar21[uVar26].width,pCVar21[uVar26].height,
                     pCVar21[uVar26].type);
          LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
          *(long *)(pcVar12 + 0x40) = *(long *)(pcVar12 + 0x40) + (long)local_290;
          *(long *)(pcVar12 + 0x48) = *(long *)(pcVar12 + 0x48) + (long)local_28c;
          local_358 = local_358 + (long)local_290 * 2;
          local_360 = local_360 + (long)local_28c * 2;
          LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
        }
        else if (CVar4 == RLE) {
          local_338 = (char *)(uVar26 * 3);
          ppcVar16 = rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar26].
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (rowPtrs.
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar26].
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppcVar16) {
            local_370 = 0;
            do {
              iVar10 = pCVar21[uVar26].width;
              if (0 < iVar10) {
                pcVar19 = ppcVar16[local_370];
                iVar9 = 0;
                do {
                  for (lVar18 = 0; iVar10 = pixelTypeSize(pCVar21[uVar26].type), lVar18 < iVar10;
                      lVar18 = lVar18 + 1) {
                    cVar2 = pcVar19[lVar18];
                    pcVar5 = pCVar21[uVar26].planarUncRleEnd[lVar18];
                    pCVar21[uVar26].planarUncRleEnd[lVar18] = pcVar5 + 1;
                    *pcVar5 = cVar2;
                  }
                  iVar9 = iVar9 + 1;
                  iVar10 = pCVar21[uVar26].width;
                  pcVar19 = pcVar19 + lVar18;
                } while (iVar9 < iVar10);
              }
              iVar9 = pixelTypeSize(pCVar21[uVar26].type);
              *(long *)(pcVar12 + 0x38) = *(long *)(pcVar12 + 0x38) + (long)(iVar9 * iVar10);
              local_370 = (ulong)((int)local_370 + 1);
              ppcVar16 = (&((rowPtrs.
                             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                           super__Vector_impl_data._M_start)[(long)local_338];
            } while (local_370 <
                     (ulong)((long)(&((rowPtrs.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish)[(long)local_338] -
                             (long)ppcVar16 >> 3));
          }
        }
        lVar18 = CONCAT62(uStack_2e6,b);
        puVar1 = (ulong *)(lVar18 + (uVar26 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar26 & 0x3f);
        pCVar21 = (this->_channelData).
                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar23 = (this->_channelData).
                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar26 = (ulong)((int)uVar26 + 1);
      uVar24 = ((long)pCVar23 - (long)pCVar21 >> 3) * -0x79435e50d79435e5;
    } while (uVar26 <= uVar24 && uVar24 - uVar26 != 0);
  }
  lVar18 = *(long *)(pcVar12 + 8);
  if (lVar18 != 0) {
    writePtr = (char *)compressBound(lVar18);
    iVar10 = compress2(compressed,&writePtr,this->_planarUncBuffer[0],lVar18,9);
    if (iVar10 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar17,"Data compression (zlib) failed.");
      __cxa_throw(pBVar17,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    compressed = compressed + (long)writePtr;
    *(char **)(pcVar12 + 0x10) = writePtr;
  }
  lVar18 = *(long *)(pcVar12 + 0x40);
  if (lVar18 == 0) goto LAB_00449801;
  if (this->_acCompression == STATIC_HUFFMAN) {
    iVar10 = hufCompress((unsigned_short *)this->_packedAcBuffer,(int)lVar18,compressed);
    pcVar19 = (char *)(long)iVar10;
LAB_004497f4:
    *(char **)(pcVar12 + 0x18) = pcVar19;
  }
  else {
    if (this->_acCompression == DEFLATE) {
      writePtr = (char *)compressBound(lVar18 * 2);
      iVar10 = compress2(compressed,&writePtr,this->_packedAcBuffer,*(long *)(pcVar12 + 0x40) * 2,9)
      ;
      pcVar19 = writePtr;
      if (iVar10 != 0) {
        this_01 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(this_01,"Data compression (zlib) failed.");
        __cxa_throw(this_01,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      goto LAB_004497f4;
    }
    pcVar19 = *(char **)(pcVar12 + 0x18);
  }
  compressed = compressed + (long)pcVar19;
LAB_00449801:
  if (*(long *)(pcVar12 + 0x48) != 0) {
    iVar10 = Zip::compress(this->_zip,this->_packedDcBuffer,(int)*(long *)(pcVar12 + 0x48) * 2,
                           compressed);
    *(long *)(pcVar12 + 0x20) = (long)iVar10;
    compressed = compressed + iVar10;
  }
  if (*(long *)(pcVar12 + 0x38) != 0) {
    iVar10 = rleCompress((int)*(long *)(pcVar12 + 0x38),this->_planarUncBuffer[2],this->_rleBuffer);
    *(long *)(pcVar12 + 0x30) = (long)iVar10;
    writePtr = (char *)compressBound();
    iVar10 = compress2(compressed,&writePtr,this->_rleBuffer,*(undefined8 *)(pcVar12 + 0x30),9);
    if (iVar10 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar17,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar17,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    *(char **)(pcVar12 + 0x28) = writePtr;
    compressed = compressed + (long)writePtr;
  }
  lVar18 = 0;
  do {
    writePtr = this->_outBuffer + lVar18;
    Xdr::write<Imf_2_5::CharPtrIO,char*>(&writePtr,*(unsigned_long *)(this->_outBuffer + lVar18));
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x58);
  pcVar12 = this->_outBuffer;
  *outPtr = pcVar12;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&rowPtrs);
  pvVar7 = (void *)CONCAT62(uStack_2e6,b);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_2c8 - (long)pvVar7);
  }
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector(&channelRules);
  return ((int)compressed - (int)pcVar12) + 1;
}

Assistant:

int 
DwaCompressor::compress
    (const char             *inPtr,
     int                    inSize,
     IMATH_NAMESPACE::Box2i range,
     const char             *&outPtr)
{
    const char *inDataPtr   = inPtr;
    char       *packedAcEnd = 0;
    char       *packedDcEnd = 0; 
    int         fileVersion = 2;   // Starting with 2, we write the channel
                                   // classification rules into the file

    if (fileVersion < 2) 
        initializeLegacyChannelRules();
    else 
        initializeDefaultChannelRules();

    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2) 
    {
        relevantChannelRules(channelRules);

        channelRuleSize = Xdr::size<unsigned short>();
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRuleSize += channelRules[i].size();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize) 
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0)
            delete[] _outBuffer;       
        _outBuffer = new char[outBufferSize];
    }

    char *outDataPtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64) +
                                   channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and deferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer)
        packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer)
        packedDcEnd = _packedDcBuffer;

    #define OBIDX(x) (Int64 *)&_outBuffer[x * sizeof (Int64)]

    Int64 *version                 = OBIDX (VERSION);
    Int64 *unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 *unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    Int64 *acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    Int64 *dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    Int64 *rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    Int64 *rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    Int64 *rleRawSize              = OBIDX (RLE_RAW_SIZE);

    Int64 *totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    Int64 *totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    Int64 *acCompression            = OBIDX (AC_COMPRESSION);

    int minX   = range.min.x;
    int maxX   = std::min(range.max.x, _max[0]);
    int minY   = range.min.y;
    int maxY   = std::min(range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (Int64));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;  
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2) 
    {
        char *writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);
        
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRules[i].write(writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size());
    std::vector< std::vector<const char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        encodedChannels[chan] = false;

    inDataPtr =  inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {

            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp(y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back(inDataPtr);
            inDataPtr += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
        }
    }

    inDataPtr = inPtr;

    // 
    // Make a pass over all our CSC sets and try to encode them first
    // 

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {

        LossyDctEncoderCsc encoder
            (_dwaCompressionLevel / 100000.f,
             rowPtrs[_cscSets[csc].idx[0]],
             rowPtrs[_cscSets[csc].idx[1]],
             rowPtrs[_cscSets[csc].idx[2]],
             packedAcEnd,
             packedDcEnd,
             dwaCompressorToNonlinear,
             _channelData[_cscSets[csc].idx[0]].width,
             _channelData[_cscSets[csc].idx[0]].height,
             _channelData[_cscSets[csc].idx[0]].type,
             _channelData[_cscSets[csc].idx[1]].type,
             _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute();

        *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
        *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

        packedAcEnd += encoder.numAcValuesEncoded() * sizeof(unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded() * sizeof(unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        if (encodedChannels[chan])
            continue;

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // For LOSSY_DCT, treat this just like the CSC'd case,
            // but only operate on one channel
            //

            {
                const unsigned short *nonlinearLut = 0;

                if (!cd->pLinear)
                    nonlinearLut = dwaCompressorToNonlinear; 

                LossyDctEncoder encoder
                    (_dwaCompressionLevel / 100000.f,
                     rowPtrs[chan],
                     packedAcEnd,
                     packedDcEnd,
                     nonlinearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                encoder.execute();

                *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
                *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

                packedAcEnd +=
                    encoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcEnd +=
                    encoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For RLE, bash the bytes up so that the first bytes of each
            // pixel are contingous, as are the second bytes, and so on.
            //

            for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
            {
                const char *row = rowPtrs[chan][y];

                for (int x = 0; x < cd->width; ++x)
                {
                    for (int byte = 0;
                         byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                         ++byte)
                    {
                            
                        *cd->planarUncRleEnd[byte]++ = *row++;
                    }
                }

                *rleRawSize += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
            }

            break;

          case UNKNOWN:
           
            //
            // Otherwise, just copy data over verbatim
            //

            {
                int scanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);

                for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
                {
                    memcpy (cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);
    
                    cd->planarUncBufferEnd += scanlineSize;
                }

                *unknownUncompressedSize += cd->planarUncSize;
            }

            break;

          default:

            assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        uLongf inSize  = (uLongf)(*unknownUncompressedSize);
        uLongf outSize = compressBound (inSize);

        if (Z_OK != ::compress2 ((Bytef *)outDataPtr,
                                 &outSize,
                                 (const Bytef *)_planarUncBuffer[UNKNOWN],
                                 inSize,
                                 9))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of 
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    { 
        switch (_acCompression)
        {
          case STATIC_HUFFMAN:

            *acCompressedSize = (int)
                hufCompress((unsigned short *)_packedAcBuffer,
                            (int)*totalAcUncompressedCount,
                            outDataPtr);                
            break;

          case DEFLATE:

            {
                uLongf destLen = compressBound (
                    (*totalAcUncompressedCount) * sizeof (unsigned short));

                if (Z_OK != ::compress2
                                ((Bytef *)outDataPtr,
                                 &destLen,
                                 (Bytef *)_packedAcBuffer, 
                                 (uLong)(*totalAcUncompressedCount
                                                * sizeof (unsigned short)),
                                 9))
                {
                    throw IEX_NAMESPACE::InputExc ("Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;        
            }

            break;

          default:
            
            assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    // 
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress
            (_packedDcBuffer,
             (int)(*totalDcUncompressedCount) * sizeof (unsigned short),
             outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    // 
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //    

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress
            ((int)(*rleRawSize),
             _planarUncBuffer[RLE],
             (signed char *)_rleBuffer);

        uLongf dstLen = compressBound ((uLongf)*rleUncompressedSize);

        if (Z_OK != ::compress2
                        ((Bytef *)outDataPtr, 
                         &dstLen, 
                         (Bytef *)_rleBuffer, 
                         (uLong)(*rleUncompressedSize),
                         9))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }
        
       *rleCompressedSize = dstLen;
        outDataPtr       += *rleCompressedSize;
    }

    // 
    // Flip the counters to XDR format
    //         

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64  src = *(((Int64 *)_outBuffer) + i);
        char  *dst = (char *)(((Int64 *)_outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int>(outDataPtr - _outBuffer + 1);
}